

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedStepIntegrator.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::FixedStepIntegrator::integrate
          (FixedStepIntegrator *this,double initialTime,double finalTime)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  element_type *peVar4;
  size_t sVar5;
  ulong uVar6;
  reference pvVar7;
  undefined4 extraout_var;
  reference pvVar8;
  ostream *poVar9;
  char *pcVar10;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar11;
  double dVar12;
  double in_XMM1_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  int i;
  double dT;
  int iterations;
  uint stateDim;
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  *in_stack_fffffffffffffbf0;
  size_type in_stack_fffffffffffffc08;
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  *in_stack_fffffffffffffc10;
  string local_378 [32];
  ostringstream local_358 [376];
  string local_1e0 [48];
  ostringstream local_1b0 [380];
  int local_34;
  double local_30;
  int local_28;
  uint local_24;
  double local_20;
  double local_18;
  byte local_1;
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 2));
  if (bVar1) {
    if (0.0 <= local_20 - local_18) {
      if (0.0 < (double)in_RDI[1]) {
        peVar4 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x380fa0);
        sVar5 = DynamicalSystem::stateSpaceSize(peVar4);
        local_24 = (uint)sVar5;
        dVar11 = ceil((local_20 - local_18) / (double)in_RDI[1]);
        local_28 = (int)dVar11;
        std::
        vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
        ::resize(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        peVar4 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x381010);
        (*peVar4->_vptr_DynamicalSystem[6])();
        uVar6 = iDynTree::VectorDynSize::size();
        if (uVar6 == local_24) {
          pvVar7 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                 *)(in_RDI + 4),0);
          iDynTree::VectorDynSize::resize((ulong)pvVar7);
          peVar4 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3810a0);
          iVar2 = (*peVar4->_vptr_DynamicalSystem[6])();
          pvVar7 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                 *)(in_RDI + 4),0);
          iDynTree::VectorDynSize::operator=
                    (&pvVar7->stateAtT,(VectorDynSize *)CONCAT44(extraout_var,iVar2));
          dVar11 = local_18;
          pvVar7 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                 *)(in_RDI + 4),0);
          pvVar7->time = dVar11;
          local_30 = 0.0;
          if (0 < local_28) {
            local_30 = (local_20 - local_18) / (double)local_28;
          }
          for (local_34 = 0; dVar11 = local_30, local_34 < local_28 + -1; local_34 = local_34 + 1) {
            dVar12 = local_30 * (double)local_34 + local_18;
            pvVar7 = std::
                     vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                   *)(in_RDI + 4),(long)local_34);
            pvVar8 = std::
                     vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                   *)(in_RDI + 4),(long)(local_34 + 1));
            uVar6 = (**(code **)(*in_RDI + 0x80))(dVar12,dVar11,in_RDI,pvVar7,pvVar8);
            if ((uVar6 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream(local_1b0);
              poVar9 = std::operator<<((ostream *)local_1b0,"Error at time ");
              poVar9 = (ostream *)
                       std::ostream::operator<<(poVar9,local_30 * (double)local_34 + local_18);
              std::operator<<(poVar9,".");
              IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x381296);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::ostringstream::str();
              pcVar10 = (char *)std::__cxx11::string::c_str();
              iDynTree::reportError(pcVar3,"integrate",pcVar10);
              std::__cxx11::string::~string(local_1e0);
              local_1 = 0;
              std::__cxx11::ostringstream::~ostringstream(local_1b0);
              goto LAB_003815be;
            }
            dVar11 = local_30 * (double)(local_34 + 1) + local_18;
            pvVar7 = std::
                     vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                   *)(in_RDI + 4),(long)(local_34 + 1));
            pvVar7->time = dVar11;
          }
          dVar11 = local_20;
          pvVar7 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                 *)(in_RDI + 4),(long)(local_28 + -1));
          local_30 = dVar11 - pvVar7->time;
          pvVar7 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                 *)(in_RDI + 4),(long)(local_28 + -1));
          dVar12 = local_30;
          dVar11 = pvVar7->time;
          pvVar7 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::operator[]((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                 *)(in_RDI + 4),(long)(local_28 + -1));
          pvVar8 = std::
                   vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   ::back(in_stack_fffffffffffffbf0);
          uVar6 = (**(code **)(*in_RDI + 0x80))(dVar11,dVar12,in_RDI,pvVar7,pvVar8);
          if ((uVar6 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_358);
            std::operator<<((ostream *)local_358,"Error in last iteration");
            IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3814d3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            std::__cxx11::ostringstream::str();
            pcVar10 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError(pcVar3,"integrate",pcVar10);
            std::__cxx11::string::~string(local_378);
            local_1 = 0;
            std::__cxx11::ostringstream::~ostringstream(local_358);
          }
          else {
            pvVar7 = std::
                     vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ::back(in_stack_fffffffffffffbf0);
            pvVar7->time = local_20;
            local_1 = 1;
          }
        }
        else {
          IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38103e);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError(pcVar3,"integrate","The initial state has a wrong dimension.");
          local_1 = 0;
        }
      }
      else {
        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x380f64);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError(pcVar3,"integrate","The maximum dT should be greater than zero.");
        local_1 = 0;
      }
    }
    else {
      IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x380f16);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError
                (pcVar3,"integrate",
                 "The final time is supposed to be greater than the initial time.");
      local_1 = 0;
    }
  }
  else {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x380ebf);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"integrate","No dynamical system have been set yet.");
    local_1 = 0;
  }
LAB_003815be:
  return (bool)(local_1 & 1);
}

Assistant:

bool FixedStepIntegrator::integrate(double initialTime, double finalTime){

                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "integrate", "No dynamical system have been set yet.");
                    return false;
                }

                if ((finalTime - initialTime) < 0){
                    reportError(m_info.name().c_str(), "integrate", "The final time is supposed to be greater than the initial time.");
                    return false;
                }
                if (m_dTmax <= 0){
                    reportError(m_info.name().c_str(), "integrate", "The maximum dT should be greater than zero.");
                    return false;
                }

                unsigned int stateDim = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());

                int iterations = std::ceil((finalTime - initialTime)/m_dTmax);

                m_solution.resize(iterations+1);

                if(m_dynamicalSystem_ptr->initialState().size() != stateDim){
                    reportError(m_info.name().c_str(), "integrate", "The initial state has a wrong dimension.");
                    return false;
                }

                m_solution[0].stateAtT.resize(stateDim);
                m_solution[0].stateAtT = m_dynamicalSystem_ptr->initialState();
                m_solution[0].time = initialTime;

                double dT = 0;
                if (iterations > 0){
                    dT = (finalTime - initialTime)/iterations;
                }

                for(int i = 0; i < (iterations - 1); ++i){
                    if (!oneStepIntegration(initialTime + dT*i, dT, m_solution[i].stateAtT, m_solution[i+1].stateAtT)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error at time " << initialTime + dT*i << ".";
                        reportError(m_info.name().c_str(), "integrate", errorMsg.str().c_str());
                        return false;
                    }
                    m_solution[i+1].time = initialTime + dT*(i+1);
                }
                //Consider last step separately to be sure that the last solution point is in finalTime
                dT = finalTime - m_solution[iterations - 1].time;
                if (!oneStepIntegration(m_solution[iterations - 1].time, dT, m_solution[iterations - 1].stateAtT, m_solution.back().stateAtT)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error in last iteration";
                    reportError(m_info.name().c_str(), "integrate", errorMsg.str().c_str());
                    return false;
                }
                m_solution.back().time = finalTime;

                return true;
            }